

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O2

char * __thiscall glcts::TessellationShaderBarrier3::getVSCode(TessellationShaderBarrier3 *this)

{
  return "${VERSION}\n\nvoid main()\n{\n}\n";
}

Assistant:

const char* TessellationShaderBarrier3::getVSCode()
{
	static const char* vs_code = "${VERSION}\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "}\n";

	return vs_code;
}